

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::compiles1c(json_service *this,int f)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  if (f == 10) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x5a);
  std::operator<<(poVar1," f==10");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles1c(int const f) { TEST(f==10); }